

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

htab_hash_t str_key_hash(tab_str_t str,void *arg)

{
  uint64_t uVar1;
  
  uVar1 = mir_hash_step(0x24,str.key);
  uVar1 = mir_hash_finish(uVar1);
  return (htab_hash_t)uVar1;
}

Assistant:

static htab_hash_t str_key_hash (tab_str_t str, void *arg MIR_UNUSED) {
  return (htab_hash_t) mir_hash64 (str.key, 0x24);
}